

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deconvolution_pack1to4.h
# Opt level: O0

void ncnn::deconvolution_pack1to4_sse
               (Mat *bottom_blob,Mat *top_blob,Mat *weight_data_packed,Mat *bias_data,int kernel_w,
               int kernel_h,int dilation_w,int dilation_h,int stride_w,int stride_h,
               int activation_type,Mat *activation_params,Option *opt)

{
  undefined4 uVar1;
  int iVar2;
  int iVar3;
  long lVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined8 uVar9;
  undefined8 uVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  long lVar67;
  long lVar68;
  long lVar69;
  long lVar70;
  int iVar71;
  int iVar72;
  undefined8 *puVar73;
  long *in_RCX;
  long *in_RDX;
  long *in_RSI;
  long *in_RDI;
  int in_R8D;
  int in_R9D;
  float fVar74;
  float fVar75;
  float fVar76;
  float fVar77;
  undefined1 auVar78 [16];
  int in_stack_00000008;
  int in_stack_00000010;
  int in_stack_00000018;
  int in_stack_00000020;
  undefined4 in_stack_00000028;
  long *in_stack_00000030;
  __m128 _w;
  __m128 _val;
  int k;
  float val;
  int sx;
  int sxs;
  int x;
  float *sptr;
  int sy;
  int sys;
  int y;
  Mat m_2;
  int q;
  float *kptr;
  __m128 _sum;
  int j;
  int i;
  int outh;
  int outw;
  int channels;
  int h;
  int w;
  int maxk;
  float *outptr;
  int p;
  float *bias_data_ptr;
  int kernel_extent_h;
  int kernel_extent_w;
  int outch;
  Mat *m;
  Mat *m_3;
  Mat *m_1;
  __m128 _b;
  __m128 _a;
  __m128 max;
  __m128 min;
  __m128 neg;
  __m128 pos;
  __m128 one;
  __m128 one_7;
  v4sf pow2n_1;
  v4sf y_2;
  v4sf mask_1;
  v4sf one_2;
  v4si emm0_1;
  v4sf fx_1;
  v4sf tmp_1;
  v4sf pow2n;
  v4sf y_1;
  v4sf mask;
  v4sf one_1;
  v4si emm0;
  v4sf fx;
  v4sf tmp;
  __m128 two;
  __m128 one_4;
  __m128 one_5;
  v4sf pow2n_2;
  v4sf y_4;
  v4sf mask_3;
  v4sf one_6;
  v4si emm0_3;
  v4sf fx_2;
  v4sf tmp_3;
  v4sf y_3;
  v4sf z;
  v4sf tmp_2;
  v4sf mask_2;
  v4sf e;
  v4sf invalid_mask;
  v4sf one_3;
  v4si emm0_2;
  int local_2474;
  int local_245c;
  int local_240c;
  long local_23c0;
  undefined8 local_23b8;
  undefined8 uStack_23b0;
  int local_23a4;
  int local_23a0;
  undefined8 *local_2330;
  int local_2324;
  undefined1 local_1fc8 [8];
  undefined8 uStack_1fc0;
  ulong uStack_1f60;
  float local_1f38;
  float fStack_1f34;
  float fStack_1f30;
  float fStack_1f2c;
  float local_1f18;
  float fStack_1f14;
  float fStack_1f10;
  float fStack_1f0c;
  float local_1e48;
  float fStack_1e44;
  float fStack_1e40;
  float fStack_1e3c;
  float local_1e38;
  float fStack_1e34;
  float fStack_1e30;
  float fStack_1e2c;
  ulong uStack_1cd0;
  float local_1c58;
  float fStack_1c54;
  float fStack_1c50;
  float fStack_1c4c;
  float fStack_1c40;
  float fStack_1c3c;
  undefined8 local_1c08;
  undefined8 uStack_1c00;
  float local_1ba8;
  float fStack_1ba4;
  float local_1b98;
  float fStack_1b94;
  float fStack_1b90;
  float fStack_1b8c;
  undefined8 local_1aa8;
  undefined8 uStack_1aa0;
  undefined8 local_1a98;
  undefined8 uStack_1a90;
  float local_1738;
  float fStack_1734;
  float fStack_1730;
  float fStack_172c;
  float local_1708;
  float fStack_1704;
  float fStack_1700;
  float fStack_16fc;
  float local_16e8;
  float fStack_16e4;
  float fStack_16e0;
  float fStack_16dc;
  undefined8 local_1658;
  undefined8 uStack_1650;
  undefined8 local_1648;
  undefined8 uStack_1640;
  float local_12e8;
  float fStack_12e4;
  float fStack_12e0;
  float fStack_12dc;
  float local_12b8;
  float fStack_12b4;
  float fStack_12b0;
  float fStack_12ac;
  float local_1298;
  float fStack_1294;
  float fStack_1290;
  float fStack_128c;
  float local_1058;
  float fStack_1054;
  float fStack_1050;
  float fStack_104c;
  float local_f78;
  float fStack_f74;
  float fStack_f70;
  float fStack_f6c;
  float local_ee8;
  float fStack_ee4;
  float fStack_ee0;
  float fStack_edc;
  float local_ec8;
  float fStack_ec4;
  float fStack_ec0;
  float fStack_ebc;
  undefined8 local_da8;
  undefined8 uStack_da0;
  undefined8 local_d98;
  undefined8 uStack_d90;
  float local_a38;
  float fStack_a34;
  float fStack_a30;
  float fStack_a2c;
  float local_a08;
  float fStack_a04;
  float fStack_a00;
  float fStack_9fc;
  float local_9e8;
  float fStack_9e4;
  float fStack_9e0;
  float fStack_9dc;
  float local_818;
  float fStack_814;
  float fStack_810;
  float fStack_80c;
  undefined8 local_7d8;
  undefined8 uStack_7d0;
  undefined8 local_798;
  undefined8 uStack_790;
  undefined8 local_758;
  undefined8 uStack_750;
  ulong uStack_700;
  float local_3d8;
  float fStack_3d4;
  float fStack_3d0;
  float fStack_3cc;
  float local_3b8;
  float fStack_3b4;
  float fStack_3b0;
  float fStack_3ac;
  float local_3a8;
  float fStack_3a4;
  float fStack_3a0;
  float fStack_39c;
  float local_388;
  float fStack_384;
  float fStack_380;
  float fStack_37c;
  float local_268;
  float fStack_264;
  float fStack_260;
  float fStack_25c;
  
  lVar67 = in_RSI[7];
  lVar4 = *in_RCX;
  for (local_2324 = 0; local_2324 < (int)lVar67; local_2324 = local_2324 + 1) {
    local_2330 = (undefined8 *)(*in_RSI + in_RSI[8] * (long)local_2324 * in_RSI[2]);
    iVar2 = *(int *)((long)in_RDI + 0x2c);
    lVar68 = in_RDI[6];
    lVar69 = in_RDI[7];
    iVar3 = *(int *)((long)in_RSI + 0x2c);
    lVar70 = in_RSI[6];
    for (local_23a0 = 0; local_23a0 < (int)lVar70; local_23a0 = local_23a0 + 1) {
      for (local_23a4 = 0; local_23a4 < iVar3; local_23a4 = local_23a4 + 1) {
        local_23b8 = 0;
        uStack_23b0 = 0;
        if (lVar4 != 0) {
          puVar73 = (undefined8 *)(lVar4 + (long)(local_2324 << 2) * 4);
          local_23b8 = *puVar73;
          uStack_23b0 = puVar73[1];
        }
        local_23c0 = *in_RDX + in_RDX[8] * (long)local_2324 * in_RDX[2];
        for (local_240c = 0; local_240c < (int)lVar69; local_240c = local_240c + 1) {
          for (local_245c = 0; local_245c < in_R9D; local_245c = local_245c + 1) {
            iVar71 = (local_23a0 + local_245c * in_stack_00000010) -
                     in_stack_00000010 * (in_R9D + -1);
            if (((-1 < iVar71) && (iVar71 % in_stack_00000020 == 0)) &&
               (iVar71 / in_stack_00000020 < (int)lVar68)) {
              for (local_2474 = 0; local_2474 < in_R8D; local_2474 = local_2474 + 1) {
                iVar72 = (local_23a4 + local_2474 * in_stack_00000008) -
                         in_stack_00000008 * (in_R8D + -1);
                if (((-1 < iVar72) && (iVar72 % in_stack_00000018 == 0)) &&
                   (iVar72 / in_stack_00000018 < iVar2)) {
                  fVar74 = *(float *)(*in_RDI + in_RDI[8] * (long)local_240c * in_RDI[2] +
                                      (long)*(int *)((long)in_RDI + 0x2c) *
                                      (long)(iVar71 / in_stack_00000020) * in_RDI[2] +
                                     (long)(iVar72 / in_stack_00000018) * 4);
                  puVar73 = (undefined8 *)
                            (local_23c0 + (long)((local_245c * in_R8D + local_2474) * 4) * 4);
                  uVar9 = *puVar73;
                  uVar10 = puVar73[1];
                  local_1f18 = (float)uVar9;
                  fStack_1f14 = (float)((ulong)uVar9 >> 0x20);
                  fStack_1f10 = (float)uVar10;
                  fStack_1f0c = (float)((ulong)uVar10 >> 0x20);
                  local_1f38 = (float)local_23b8;
                  fStack_1f34 = (float)((ulong)local_23b8 >> 0x20);
                  fStack_1f30 = (float)uStack_23b0;
                  fStack_1f2c = (float)((ulong)uStack_23b0 >> 0x20);
                  local_23b8 = CONCAT44(fVar74 * fStack_1f14 + fStack_1f34,
                                        fVar74 * local_1f18 + local_1f38);
                  uStack_23b0 = CONCAT44(fVar74 * fStack_1f0c + fStack_1f2c,
                                         fVar74 * fStack_1f10 + fStack_1f30);
                }
              }
            }
          }
          local_23c0 = local_23c0 + (long)(in_R8D * in_R9D * 4) * 4;
        }
        fStack_1c40 = (float)uStack_23b0;
        fStack_1c3c = (float)((ulong)uStack_23b0 >> 0x20);
        local_1ba8 = (float)local_23b8;
        fStack_1ba4 = (float)((ulong)local_23b8 >> 0x20);
        switch(in_stack_00000028) {
        case 1:
          uStack_1f60 = SUB168(ZEXT816(0),4);
          auVar11._8_8_ = uStack_23b0;
          auVar11._0_8_ = local_23b8;
          auVar63._8_8_ = 0;
          auVar63._0_8_ = uStack_1f60;
          _local_1fc8 = vmaxps_avx(auVar11,auVar63 << 0x40);
          break;
        case 2:
          fVar74 = *(float *)*in_stack_00000030;
          auVar14._8_8_ = uStack_23b0;
          auVar14._0_8_ = local_23b8;
          auVar7 = vmaxps_avx(ZEXT816(0),auVar14);
          auVar15._8_8_ = uStack_23b0;
          auVar15._0_8_ = local_23b8;
          auVar5 = vminps_avx(ZEXT816(0),auVar15);
          local_1e38 = auVar5._0_4_;
          fStack_1e34 = auVar5._4_4_;
          fStack_1e30 = auVar5._8_4_;
          fStack_1e2c = auVar5._12_4_;
          local_1e48 = auVar7._0_4_;
          fStack_1e44 = auVar7._4_4_;
          fStack_1e40 = auVar7._8_4_;
          fStack_1e3c = auVar7._12_4_;
          local_1fc8._4_4_ = fStack_1e44 + fVar74 * fStack_1e34;
          local_1fc8._0_4_ = local_1e48 + fVar74 * local_1e38;
          uStack_1fc0._0_4_ = fStack_1e40 + fVar74 * fStack_1e30;
          uStack_1fc0._4_4_ = fStack_1e3c + fVar74 * fStack_1e2c;
          break;
        case 3:
          uVar1 = *(undefined4 *)*in_stack_00000030;
          auVar12._4_4_ = uVar1;
          auVar12._0_4_ = uVar1;
          auVar12._12_4_ = uVar1;
          auVar12._8_4_ = uVar1;
          uVar1 = *(undefined4 *)(*in_stack_00000030 + 4);
          auVar16._4_4_ = uVar1;
          auVar16._0_4_ = uVar1;
          auVar16._12_4_ = uVar1;
          auVar16._8_4_ = uVar1;
          auVar13._8_8_ = uStack_23b0;
          auVar13._0_8_ = local_23b8;
          auVar7 = vmaxps_avx(auVar13,auVar12);
          _local_1fc8 = vminps_avx(auVar7,auVar16);
          break;
        case 4:
          auVar17._8_8_ = 0x3f8000003f800000;
          auVar17._0_8_ = 0x3f8000003f800000;
          uStack_1cd0 = SUB168(ZEXT816(0),4);
          auVar64._8_8_ = 0;
          auVar64._0_8_ = uStack_1cd0;
          auVar26._8_8_ = uStack_23b0;
          auVar26._0_8_ = local_23b8;
          auVar7 = vsubps_avx(auVar64 << 0x40,auVar26);
          auVar25._8_8_ = 0x42b0c0a542b0c0a5;
          auVar25._0_8_ = 0x42b0c0a542b0c0a5;
          auVar7 = vminps_avx(auVar7,auVar25);
          auVar24._8_8_ = 0xc2b0c0a5c2b0c0a5;
          auVar24._0_8_ = 0xc2b0c0a5c2b0c0a5;
          auVar6 = vmaxps_avx(auVar7,auVar24);
          local_1298 = auVar6._0_4_;
          fStack_1294 = auVar6._4_4_;
          fStack_1290 = auVar6._8_4_;
          fStack_128c = auVar6._12_4_;
          fVar74 = local_1298 * 1.442695 + 0.5;
          fVar75 = fStack_1294 * 1.442695 + 0.5;
          fVar76 = fStack_1290 * 1.442695 + 0.5;
          fVar77 = fStack_128c * 1.442695 + 0.5;
          local_1648 = CONCAT44(fVar75,fVar74);
          uStack_1640._0_4_ = fVar76;
          uStack_1640._4_4_ = fVar77;
          local_1658 = CONCAT44((int)fVar75,(int)fVar74);
          uStack_1650._0_4_ = (int)fVar76;
          uStack_1650._4_4_ = (int)fVar77;
          auVar27._8_8_ = uStack_1650;
          auVar27._0_8_ = local_1658;
          auVar5 = vcvtdq2ps_avx(auVar27);
          auVar29._8_8_ = uStack_1640;
          auVar29._0_8_ = local_1648;
          auVar7 = vcmpps_avx(auVar29,auVar5,1);
          auVar31._8_8_ = 0x3f8000003f800000;
          auVar31._0_8_ = 0x3f8000003f800000;
          auVar7 = vpand_avx(auVar7,auVar31);
          auVar7 = vsubps_avx(auVar5,auVar7);
          local_1058 = auVar7._0_4_;
          fStack_1054 = auVar7._4_4_;
          fStack_1050 = auVar7._8_4_;
          fStack_104c = auVar7._12_4_;
          auVar34._4_4_ = fStack_1054 * 0.6933594;
          auVar34._0_4_ = local_1058 * 0.6933594;
          auVar34._8_4_ = fStack_1050 * 0.6933594;
          auVar34._12_4_ = fStack_104c * 0.6933594;
          auVar7 = vsubps_avx(auVar6,auVar34);
          auVar33._4_4_ = fStack_1054 * -0.00021219444;
          auVar33._0_4_ = local_1058 * -0.00021219444;
          auVar33._8_4_ = fStack_1050 * -0.00021219444;
          auVar33._12_4_ = fStack_104c * -0.00021219444;
          auVar7 = vsubps_avx(auVar7,auVar33);
          local_12b8 = auVar7._0_4_;
          fStack_12b4 = auVar7._4_4_;
          fStack_12b0 = auVar7._8_4_;
          fStack_12ac = auVar7._12_4_;
          local_1658 = CONCAT44((int)fStack_1054,(int)local_1058);
          uStack_1650._0_4_ = (int)fStack_1050;
          uStack_1650._4_4_ = (int)fStack_104c;
          auVar23._8_8_ = uStack_1650;
          auVar23._0_8_ = local_1658;
          auVar22._8_8_ = 0x7f0000007f;
          auVar22._0_8_ = 0x7f0000007f;
          auVar7 = vpaddd_avx(auVar23,auVar22);
          auVar7 = vpslld_avx(auVar7,ZEXT416(0x17));
          local_12e8 = auVar7._0_4_;
          fStack_12e4 = auVar7._4_4_;
          fStack_12e0 = auVar7._8_4_;
          fStack_12dc = auVar7._12_4_;
          auVar18._4_4_ =
               ((((((fStack_12b4 * 0.00019875691 + 0.0013981999) * fStack_12b4 + 0.008333452) *
                   fStack_12b4 + 0.041665796) * fStack_12b4 + 0.16666666) * fStack_12b4 + 0.5) *
                fStack_12b4 * fStack_12b4 + fStack_12b4 + 1.0) * fStack_12e4 + 1.0;
          auVar18._0_4_ =
               ((((((local_12b8 * 0.00019875691 + 0.0013981999) * local_12b8 + 0.008333452) *
                   local_12b8 + 0.041665796) * local_12b8 + 0.16666666) * local_12b8 + 0.5) *
                local_12b8 * local_12b8 + local_12b8 + 1.0) * local_12e8 + 1.0;
          auVar18._8_4_ =
               ((((((fStack_12b0 * 0.00019875691 + 0.0013981999) * fStack_12b0 + 0.008333452) *
                   fStack_12b0 + 0.041665796) * fStack_12b0 + 0.16666666) * fStack_12b0 + 0.5) *
                fStack_12b0 * fStack_12b0 + fStack_12b0 + 1.0) * fStack_12e0 + 1.0;
          auVar18._12_4_ =
               ((((((fStack_12ac * 0.00019875691 + 0.0013981999) * fStack_12ac + 0.008333452) *
                   fStack_12ac + 0.041665796) * fStack_12ac + 0.16666666) * fStack_12ac + 0.5) *
                fStack_12ac * fStack_12ac + fStack_12ac + 1.0) * fStack_12dc + 1.0;
          _local_1fc8 = vdivps_avx(auVar17,auVar18);
          break;
        case 5:
          auVar21._8_8_ = uStack_23b0;
          auVar21._0_8_ = local_23b8;
          auVar20._8_8_ = 0x42b0c0a542b0c0a5;
          auVar20._0_8_ = 0x42b0c0a542b0c0a5;
          auVar7 = vminps_avx(auVar21,auVar20);
          auVar19._8_8_ = 0xc2b0c0a5c2b0c0a5;
          auVar19._0_8_ = 0xc2b0c0a5c2b0c0a5;
          auVar6 = vmaxps_avx(auVar7,auVar19);
          local_16e8 = auVar6._0_4_;
          fStack_16e4 = auVar6._4_4_;
          fStack_16e0 = auVar6._8_4_;
          fStack_16dc = auVar6._12_4_;
          fVar74 = local_16e8 * 1.442695 + 0.5;
          fVar75 = fStack_16e4 * 1.442695 + 0.5;
          fVar76 = fStack_16e0 * 1.442695 + 0.5;
          fVar77 = fStack_16dc * 1.442695 + 0.5;
          local_1a98 = CONCAT44(fVar75,fVar74);
          uStack_1a90._0_4_ = fVar76;
          uStack_1a90._4_4_ = fVar77;
          local_1aa8 = CONCAT44((int)fVar75,(int)fVar74);
          uStack_1aa0._0_4_ = (int)fVar76;
          uStack_1aa0._4_4_ = (int)fVar77;
          auVar28._8_8_ = uStack_1aa0;
          auVar28._0_8_ = local_1aa8;
          auVar5 = vcvtdq2ps_avx(auVar28);
          auVar30._8_8_ = uStack_1a90;
          auVar30._0_8_ = local_1a98;
          auVar7 = vcmpps_avx(auVar30,auVar5,1);
          auVar32._8_8_ = 0x3f8000003f800000;
          auVar32._0_8_ = 0x3f8000003f800000;
          auVar7 = vpand_avx(auVar7,auVar32);
          auVar7 = vsubps_avx(auVar5,auVar7);
          local_f78 = auVar7._0_4_;
          fStack_f74 = auVar7._4_4_;
          fStack_f70 = auVar7._8_4_;
          fStack_f6c = auVar7._12_4_;
          auVar36._4_4_ = fStack_f74 * 0.6933594;
          auVar36._0_4_ = local_f78 * 0.6933594;
          auVar36._8_4_ = fStack_f70 * 0.6933594;
          auVar36._12_4_ = fStack_f6c * 0.6933594;
          auVar7 = vsubps_avx(auVar6,auVar36);
          auVar35._4_4_ = fStack_f74 * -0.00021219444;
          auVar35._0_4_ = local_f78 * -0.00021219444;
          auVar35._8_4_ = fStack_f70 * -0.00021219444;
          auVar35._12_4_ = fStack_f6c * -0.00021219444;
          auVar7 = vsubps_avx(auVar7,auVar35);
          local_1708 = auVar7._0_4_;
          fStack_1704 = auVar7._4_4_;
          fStack_1700 = auVar7._8_4_;
          fStack_16fc = auVar7._12_4_;
          local_1aa8 = CONCAT44((int)fStack_f74,(int)local_f78);
          uStack_1aa0._0_4_ = (int)fStack_f70;
          uStack_1aa0._4_4_ = (int)fStack_f6c;
          auVar8._8_8_ = uStack_1aa0;
          auVar8._0_8_ = local_1aa8;
          auVar6._8_8_ = 0x7f0000007f;
          auVar6._0_8_ = 0x7f0000007f;
          auVar7 = vpaddd_avx(auVar8,auVar6);
          auVar7 = vpslld_avx(auVar7,ZEXT416(0x17));
          local_1738 = auVar7._0_4_;
          fStack_1734 = auVar7._4_4_;
          fStack_1730 = auVar7._8_4_;
          fStack_172c = auVar7._12_4_;
          local_758 = CONCAT44(((((((fStack_1704 * 0.00019875691 + 0.0013981999) * fStack_1704 +
                                   0.008333452) * fStack_1704 + 0.041665796) * fStack_1704 +
                                 0.16666666) * fStack_1704 + 0.5) * fStack_1704 * fStack_1704 +
                                fStack_1704 + 1.0) * fStack_1734 + 1.0,
                               ((((((local_1708 * 0.00019875691 + 0.0013981999) * local_1708 +
                                   0.008333452) * local_1708 + 0.041665796) * local_1708 +
                                 0.16666666) * local_1708 + 0.5) * local_1708 * local_1708 +
                                local_1708 + 1.0) * local_1738 + 1.0);
          uStack_750._0_4_ =
               ((((((fStack_1700 * 0.00019875691 + 0.0013981999) * fStack_1700 + 0.008333452) *
                   fStack_1700 + 0.041665796) * fStack_1700 + 0.16666666) * fStack_1700 + 0.5) *
                fStack_1700 * fStack_1700 + fStack_1700 + 1.0) * fStack_1730 + 1.0;
          uStack_750._4_4_ =
               ((((((fStack_16fc * 0.00019875691 + 0.0013981999) * fStack_16fc + 0.008333452) *
                   fStack_16fc + 0.041665796) * fStack_16fc + 0.16666666) * fStack_16fc + 0.5) *
                fStack_16fc * fStack_16fc + fStack_16fc + 1.0) * fStack_172c + 1.0;
          uStack_700 = SUB168(ZEXT816(0),4);
          auVar59._8_8_ = uStack_750;
          auVar59._0_8_ = local_758;
          auVar65._8_8_ = 0;
          auVar65._0_8_ = uStack_700;
          auVar7 = vcmpps_avx(auVar59,auVar65 << 0x40,2);
          auVar52._8_8_ = uStack_750;
          auVar52._0_8_ = local_758;
          auVar51._8_8_ = 0x80000000800000;
          auVar51._0_8_ = 0x80000000800000;
          auVar5 = vmaxps_avx(auVar52,auVar51);
          auVar6 = vpsrld_avx(auVar5,ZEXT416(0x17));
          auVar56._8_8_ = 0x807fffff807fffff;
          auVar56._0_8_ = 0x807fffff807fffff;
          auVar5 = vpand_avx(auVar5,auVar56);
          auVar61._8_8_ = 0x3f0000003f000000;
          auVar61._0_8_ = 0x3f0000003f000000;
          auVar8 = vpor_avx(auVar5,auVar61);
          auVar50._8_8_ = 0x7f0000007f;
          auVar50._0_8_ = 0x7f0000007f;
          auVar5 = vpsubd_avx(auVar6,auVar50);
          auVar5 = vcvtdq2ps_avx(auVar5);
          local_388 = auVar5._0_4_;
          fStack_384 = auVar5._4_4_;
          fStack_380 = auVar5._8_4_;
          fStack_37c = auVar5._12_4_;
          local_798 = CONCAT44(fStack_384 + 1.0,local_388 + 1.0);
          uStack_790._0_4_ = fStack_380 + 1.0;
          uStack_790._4_4_ = fStack_37c + 1.0;
          auVar62._8_8_ = 0x3f3504f33f3504f3;
          auVar62._0_8_ = 0x3f3504f33f3504f3;
          auVar5 = vcmpps_avx(auVar8,auVar62,1);
          auVar6 = vpand_avx(auVar8,auVar5);
          auVar54._8_8_ = 0x3f8000003f800000;
          auVar54._0_8_ = 0x3f8000003f800000;
          auVar8 = vsubps_avx(auVar8,auVar54);
          auVar55._8_8_ = 0x3f8000003f800000;
          auVar55._0_8_ = 0x3f8000003f800000;
          auVar5 = vpand_avx(auVar55,auVar5);
          auVar53._8_8_ = uStack_790;
          auVar53._0_8_ = local_798;
          auVar5 = vsubps_avx(auVar53,auVar5);
          local_3a8 = auVar8._0_4_;
          fStack_3a4 = auVar8._4_4_;
          fStack_3a0 = auVar8._8_4_;
          fStack_39c = auVar8._12_4_;
          local_3b8 = auVar6._0_4_;
          fStack_3b4 = auVar6._4_4_;
          fStack_3b0 = auVar6._8_4_;
          fStack_3ac = auVar6._12_4_;
          local_3a8 = local_3a8 + local_3b8;
          fStack_3a4 = fStack_3a4 + fStack_3b4;
          fStack_3a0 = fStack_3a0 + fStack_3b0;
          fStack_39c = fStack_39c + fStack_3ac;
          local_268 = auVar5._0_4_;
          fStack_264 = auVar5._4_4_;
          fStack_260 = auVar5._8_4_;
          fStack_25c = auVar5._12_4_;
          local_7d8 = CONCAT44(fStack_264 * -0.00021219444 +
                               ((((((((fStack_3a4 * 0.070376836 + -0.1151461) * fStack_3a4 +
                                     0.116769984) * fStack_3a4 + -0.12420141) * fStack_3a4 +
                                   0.14249323) * fStack_3a4 + -0.16668057) * fStack_3a4 + 0.20000714
                                 ) * fStack_3a4 + -0.24999994) * fStack_3a4 + 0.3333333) *
                               fStack_3a4 * fStack_3a4 * fStack_3a4,
                               local_268 * -0.00021219444 +
                               ((((((((local_3a8 * 0.070376836 + -0.1151461) * local_3a8 +
                                     0.116769984) * local_3a8 + -0.12420141) * local_3a8 +
                                   0.14249323) * local_3a8 + -0.16668057) * local_3a8 + 0.20000714)
                                 * local_3a8 + -0.24999994) * local_3a8 + 0.3333333) * local_3a8 *
                               local_3a8 * local_3a8);
          uStack_7d0._0_4_ =
               fStack_260 * -0.00021219444 +
               ((((((((fStack_3a0 * 0.070376836 + -0.1151461) * fStack_3a0 + 0.116769984) *
                     fStack_3a0 + -0.12420141) * fStack_3a0 + 0.14249323) * fStack_3a0 + -0.16668057
                  ) * fStack_3a0 + 0.20000714) * fStack_3a0 + -0.24999994) * fStack_3a0 + 0.3333333)
               * fStack_3a0 * fStack_3a0 * fStack_3a0;
          uStack_7d0._4_4_ =
               fStack_25c * -0.00021219444 +
               ((((((((fStack_39c * 0.070376836 + -0.1151461) * fStack_39c + 0.116769984) *
                     fStack_39c + -0.12420141) * fStack_39c + 0.14249323) * fStack_39c + -0.16668057
                  ) * fStack_39c + 0.20000714) * fStack_39c + -0.24999994) * fStack_39c + 0.3333333)
               * fStack_39c * fStack_39c * fStack_39c;
          auVar58._8_8_ = uStack_7d0;
          auVar58._0_8_ = local_7d8;
          auVar57._4_4_ = fStack_3a4 * fStack_3a4 * 0.5;
          auVar57._0_4_ = local_3a8 * local_3a8 * 0.5;
          auVar57._8_4_ = fStack_3a0 * fStack_3a0 * 0.5;
          auVar57._12_4_ = fStack_39c * fStack_39c * 0.5;
          auVar5 = vsubps_avx(auVar58,auVar57);
          local_3d8 = auVar5._0_4_;
          fStack_3d4 = auVar5._4_4_;
          fStack_3d0 = auVar5._8_4_;
          fStack_3cc = auVar5._12_4_;
          local_758 = CONCAT44(fStack_264 * 0.6933594 + fStack_3a4 + fStack_3d4,
                               local_268 * 0.6933594 + local_3a8 + local_3d8);
          uStack_750._0_4_ = fStack_260 * 0.6933594 + fStack_3a0 + fStack_3d0;
          uStack_750._4_4_ = fStack_25c * 0.6933594 + fStack_39c + fStack_3cc;
          auVar60._8_8_ = uStack_750;
          auVar60._0_8_ = local_758;
          auVar7 = vpor_avx(auVar60,auVar7);
          local_ec8 = auVar7._0_4_;
          fStack_ec4 = auVar7._4_4_;
          fStack_ec0 = auVar7._8_4_;
          fStack_ebc = auVar7._12_4_;
          auVar43._4_4_ = fStack_ec4 * 2.0;
          auVar43._0_4_ = local_ec8 * 2.0;
          auVar43._12_4_ = fStack_ebc * 2.0;
          auVar43._8_4_ = fStack_ec0 * 2.0;
          auVar66._8_8_ = 0;
          auVar66._0_8_ = uStack_700;
          auVar7 = vsubps_avx(auVar66 << 0x40,auVar43);
          auVar42._8_8_ = 0x42b0c0a542b0c0a5;
          auVar42._0_8_ = 0x42b0c0a542b0c0a5;
          auVar7 = vminps_avx(auVar7,auVar42);
          auVar41._8_8_ = 0xc2b0c0a5c2b0c0a5;
          auVar41._0_8_ = 0xc2b0c0a5c2b0c0a5;
          auVar6 = vmaxps_avx(auVar7,auVar41);
          local_9e8 = auVar6._0_4_;
          fStack_9e4 = auVar6._4_4_;
          fStack_9e0 = auVar6._8_4_;
          fStack_9dc = auVar6._12_4_;
          fVar74 = local_9e8 * 1.442695 + 0.5;
          fVar75 = fStack_9e4 * 1.442695 + 0.5;
          fVar76 = fStack_9e0 * 1.442695 + 0.5;
          fVar77 = fStack_9dc * 1.442695 + 0.5;
          local_d98 = CONCAT44(fVar75,fVar74);
          uStack_d90._0_4_ = fVar76;
          uStack_d90._4_4_ = fVar77;
          local_da8 = CONCAT44((int)fVar75,(int)fVar74);
          uStack_da0._0_4_ = (int)fVar76;
          uStack_da0._4_4_ = (int)fVar77;
          auVar45._8_8_ = uStack_da0;
          auVar45._0_8_ = local_da8;
          auVar5 = vcvtdq2ps_avx(auVar45);
          auVar46._8_8_ = uStack_d90;
          auVar46._0_8_ = local_d98;
          auVar7 = vcmpps_avx(auVar46,auVar5,1);
          auVar47._8_8_ = 0x3f8000003f800000;
          auVar47._0_8_ = 0x3f8000003f800000;
          auVar7 = vpand_avx(auVar7,auVar47);
          auVar7 = vsubps_avx(auVar5,auVar7);
          local_818 = auVar7._0_4_;
          fStack_814 = auVar7._4_4_;
          fStack_810 = auVar7._8_4_;
          fStack_80c = auVar7._12_4_;
          auVar49._4_4_ = fStack_814 * 0.6933594;
          auVar49._0_4_ = local_818 * 0.6933594;
          auVar49._8_4_ = fStack_810 * 0.6933594;
          auVar49._12_4_ = fStack_80c * 0.6933594;
          auVar7 = vsubps_avx(auVar6,auVar49);
          auVar48._4_4_ = fStack_814 * -0.00021219444;
          auVar48._0_4_ = local_818 * -0.00021219444;
          auVar48._8_4_ = fStack_810 * -0.00021219444;
          auVar48._12_4_ = fStack_80c * -0.00021219444;
          auVar7 = vsubps_avx(auVar7,auVar48);
          local_a08 = auVar7._0_4_;
          fStack_a04 = auVar7._4_4_;
          fStack_a00 = auVar7._8_4_;
          fStack_9fc = auVar7._12_4_;
          local_da8 = CONCAT44((int)fStack_814,(int)local_818);
          uStack_da0._0_4_ = (int)fStack_810;
          uStack_da0._4_4_ = (int)fStack_80c;
          auVar40._8_8_ = uStack_da0;
          auVar40._0_8_ = local_da8;
          auVar39._8_8_ = 0x7f0000007f;
          auVar39._0_8_ = 0x7f0000007f;
          auVar7 = vpaddd_avx(auVar40,auVar39);
          auVar7 = vpslld_avx(auVar7,ZEXT416(0x17));
          local_a38 = auVar7._0_4_;
          fStack_a34 = auVar7._4_4_;
          fStack_a30 = auVar7._8_4_;
          fStack_a2c = auVar7._12_4_;
          auVar38._8_8_ = 0x3f8000003f800000;
          auVar38._0_8_ = 0x3f8000003f800000;
          auVar37._4_4_ =
               (((((fStack_a04 * (fStack_a04 * 0.00019875691 + 0.0013981999) + 0.008333452) *
                   fStack_a04 + 0.041665796) * fStack_a04 + 0.16666666) * fStack_a04 + 0.5) *
                fStack_a04 * fStack_a04 + fStack_a04 + 1.0) * fStack_a34 + 1.0;
          auVar37._0_4_ =
               (((((local_a08 * (local_a08 * 0.00019875691 + 0.0013981999) + 0.008333452) *
                   local_a08 + 0.041665796) * local_a08 + 0.16666666) * local_a08 + 0.5) *
                local_a08 * local_a08 + local_a08 + 1.0) * local_a38 + 1.0;
          auVar37._8_4_ =
               (((((fStack_a00 * (fStack_a00 * 0.00019875691 + 0.0013981999) + 0.008333452) *
                   fStack_a00 + 0.041665796) * fStack_a00 + 0.16666666) * fStack_a00 + 0.5) *
                fStack_a00 * fStack_a00 + fStack_a00 + 1.0) * fStack_a30 + 1.0;
          auVar37._12_4_ =
               (((((fStack_9fc * (fStack_9fc * 0.00019875691 + 0.0013981999) + 0.008333452) *
                   fStack_9fc + 0.041665796) * fStack_9fc + 0.16666666) * fStack_9fc + 0.5) *
                fStack_9fc * fStack_9fc + fStack_9fc + 1.0) * fStack_a2c + 1.0;
          auVar7 = vdivps_avx(auVar38,auVar37);
          local_ee8 = auVar7._0_4_;
          fStack_ee4 = auVar7._4_4_;
          fStack_ee0 = auVar7._8_4_;
          fStack_edc = auVar7._12_4_;
          auVar78._0_4_ = local_ee8 * 2.0;
          auVar78._4_4_ = fStack_ee4 * 2.0;
          auVar78._8_4_ = fStack_ee0 * 2.0;
          auVar78._12_4_ = fStack_edc * 2.0;
          auVar44._8_8_ = 0x3f8000003f800000;
          auVar44._0_8_ = 0x3f8000003f800000;
          auVar7 = vsubps_avx(auVar78,auVar44);
          local_1c58 = auVar7._0_4_;
          fStack_1c54 = auVar7._4_4_;
          fStack_1c50 = auVar7._8_4_;
          fStack_1c4c = auVar7._12_4_;
          local_1fc8._4_4_ = fStack_1ba4 * fStack_1c54;
          local_1fc8._0_4_ = local_1ba8 * local_1c58;
          uStack_1fc0._0_4_ = fStack_1c40 * fStack_1c50;
          uStack_1fc0._4_4_ = fStack_1c3c * fStack_1c4c;
          break;
        case 6:
          fVar74 = *(float *)*in_stack_00000030;
          fVar75 = *(float *)(*in_stack_00000030 + 4);
          local_1c08 = CONCAT44(fStack_1ba4 * fVar74 + fVar75,local_1ba8 * fVar74 + fVar75);
          uStack_1c00._0_4_ = fStack_1c40 * fVar74 + fVar75;
          uStack_1c00._4_4_ = fStack_1c3c * fVar74 + fVar75;
          auVar7._8_8_ = uStack_1c00;
          auVar7._0_8_ = local_1c08;
          auVar7 = vmaxps_avx(auVar7,ZEXT816(0));
          auVar5._8_8_ = 0x3f8000003f800000;
          auVar5._0_8_ = 0x3f8000003f800000;
          auVar7 = vminps_avx(auVar7,auVar5);
          local_1b98 = auVar7._0_4_;
          fStack_1b94 = auVar7._4_4_;
          fStack_1b90 = auVar7._8_4_;
          fStack_1b8c = auVar7._12_4_;
          local_1fc8._4_4_ = fStack_1b94 * fStack_1ba4;
          local_1fc8._0_4_ = local_1b98 * local_1ba8;
          uStack_1fc0._0_4_ = fStack_1b90 * fStack_1c40;
          uStack_1fc0._4_4_ = fStack_1b8c * fStack_1c3c;
          break;
        default:
          uStack_1fc0 = uStack_23b0;
          local_1fc8 = (undefined1  [8])local_23b8;
        }
        *local_2330 = local_1fc8;
        local_2330[1] = uStack_1fc0;
        local_2330 = local_2330 + 2;
      }
    }
  }
  return;
}

Assistant:

static void deconvolution_pack1to4_sse(const Mat& bottom_blob, Mat& top_blob, const Mat& weight_data_packed, const Mat& bias_data, int kernel_w, int kernel_h, int dilation_w, int dilation_h, int stride_w, int stride_h, int activation_type, const Mat& activation_params, const Option& opt)
{
    int outch = top_blob.c;

    const int kernel_extent_w = dilation_w * (kernel_w - 1) + 1;
    const int kernel_extent_h = dilation_h * (kernel_h - 1) + 1;

    const float* bias_data_ptr = bias_data;

    // num_output
    #pragma omp parallel for num_threads(opt.num_threads)
    for (int p = 0; p < outch; p++)
    {
        float* outptr = top_blob.channel(p);

        const int maxk = kernel_w * kernel_h;

        // shadowed variable for less openmp task args
        const int w = bottom_blob.w;
        const int h = bottom_blob.h;
        const int channels = bottom_blob.c;
        const int outw = top_blob.w;
        const int outh = top_blob.h;

        for (int i = 0; i < outh; i++)
        {
            for (int j = 0; j < outw; j++)
            {
                __m128 _sum = _mm_setzero_ps();

                if (bias_data_ptr)
                {
                    _sum = _mm_loadu_ps(bias_data_ptr + p * 4);
                }

                const float* kptr = weight_data_packed.channel(p);

                // channels
                for (int q = 0; q < channels; q++)
                {
                    const Mat m = bottom_blob.channel(q);

                    for (int y = 0; y < kernel_h; y++)
                    {
                        int sys = (i + y * dilation_h - (kernel_extent_h - 1));
                        if (sys < 0 || sys % stride_h != 0)
                            continue;

                        int sy = sys / stride_h;
                        if (sy >= h)
                            continue;

                        const float* sptr = m.row(sy);

                        for (int x = 0; x < kernel_w; x++)
                        {
                            int sxs = (j + x * dilation_w - (kernel_extent_w - 1));
                            if (sxs < 0 || sxs % stride_w != 0)
                                continue;

                            int sx = sxs / stride_w;
                            if (sx >= w)
                                continue;

                            float val = sptr[sx];

                            int k = y * kernel_w + x;

                            __m128 _val = _mm_set1_ps(val);
                            __m128 _w = _mm_load_ps(kptr + k * 4);
                            _sum = _mm_comp_fmadd_ps(_val, _w, _sum);
                        }
                    }

                    kptr += maxk * 4;
                }

                _sum = activation_sse(_sum, activation_type, activation_params);

                _mm_storeu_ps(outptr, _sum);
                outptr += 4;
            }
        }
    }
}